

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdg_utils.hpp
# Opt level: O0

void xdg_utils::string_utils::
     split<std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
               (string *s,string *delimiter,
               back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               result)

{
  long lVar1;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pbVar2;
  long lVar3;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  value_type local_88;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  value_type local_50;
  long local_30;
  size_t end;
  size_t start;
  string *delimiter_local;
  string *s_local;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  result_local;
  
  end = 0;
  start = (size_t)delimiter;
  delimiter_local = s;
  s_local = (string *)result.container;
  local_30 = std::__cxx11::string::find((string *)s,(ulong)delimiter);
  while (local_30 != -1) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)delimiter_local);
    local_58 = std::
               back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator++((back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&s_local,0);
    pbVar2 = std::
             back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_58);
    std::
    back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(pbVar2,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    lVar1 = local_30;
    lVar3 = std::__cxx11::string::length();
    end = lVar1 + lVar3;
    local_30 = std::__cxx11::string::find((string *)delimiter_local,start);
  }
  std::__cxx11::string::substr((ulong)&local_88,(ulong)delimiter_local);
  local_90 = std::
             back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator++((back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&s_local,0);
  pbVar2 = std::
           back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_90);
  std::
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(pbVar2,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

static void split(const std::string& s,
                  const std::string& delimiter,
                  Out result) {
  size_t start = 0;
  size_t end = s.find(delimiter);

  while (end != std::string::npos) {
    *(result++) = s.substr(start, end - start);
    start = end + delimiter.length();
    end = s.find(delimiter, start);
  }

  *(result++) = s.substr(start, end);
}